

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vmhraddshs_ppc64
               (CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  int16_t iVar1;
  int32_t t;
  int32_t prod;
  int i;
  int sat;
  ppc_avr_t *c_local;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  CPUPPCState_conflict2 *env_local;
  
  prod = 0;
  _i = c;
  c_local = b;
  b_local = a;
  a_local = r;
  r_local = (ppc_avr_t *)env;
  for (t = 0; (uint)t < 8; t = t + 1) {
    iVar1 = cvtswsh((int)_i->s16[t] + ((int)b_local->s16[t] * (int)c_local->s16[t] + 0x4000 >> 0xf),
                    &prod);
    a_local->s16[t] = iVar1;
  }
  if (prod != 0) {
    set_vscr_sat((CPUPPCState_conflict2 *)&r_local->f128);
  }
  return;
}

Assistant:

void helper_vmhraddshs(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                       ppc_avr_t *b, ppc_avr_t *c)
{
    int sat = 0;
    int i;

    for (i = 0; i < ARRAY_SIZE(r->s16); i++) {
        int32_t prod = a->s16[i] * b->s16[i] + 0x00004000;
        int32_t t = (int32_t)c->s16[i] + (prod >> 15);
        r->s16[i] = cvtswsh(t, &sat);
    }

    if (sat) {
        set_vscr_sat(env);
    }
}